

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::LineGeometry::LineGeometry
          (LineGeometry *this,uint64_t id,Element *element,string *name,Document *doc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Scope *sc;
  Element *el;
  Element *el_00;
  string local_58;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_38;
  
  Geometry::Geometry(&this->super_Geometry,id,element,name,doc);
  (this->super_Geometry).super_Object._vptr_Object = (_func_int **)&PTR__LineGeometry_008ce890;
  local_38 = &this->m_vertices;
  (this->m_vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sc = (element->compound)._M_t.
       super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t.
       super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
       super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  if (sc != (Scope *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Points","");
    el = GetRequiredElement(sc,&local_58,element);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"PointsIndex","");
    el_00 = GetRequiredElement(sc,&local_58,element);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    ParseVectorDataArray(local_38,el);
    ParseVectorDataArray(&this->m_indices,el_00);
    return;
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"failed to read Geometry object (class: Line), no data scope found"
             ,"");
  Util::DOMError(&local_58,(Element *)0x0);
}

Assistant:

LineGeometry::LineGeometry(uint64_t id, const Element& element, const std::string& name, const Document& doc)
    : Geometry(id, element, name, doc)
{
    const Scope* sc = element.Compound();
    if (!sc) {
        DOMError("failed to read Geometry object (class: Line), no data scope found");
    }
    const Element& Points = GetRequiredElement(*sc, "Points", &element);
    const Element& PointsIndex = GetRequiredElement(*sc, "PointsIndex", &element);
    ParseVectorDataArray(m_vertices, Points);
    ParseVectorDataArray(m_indices, PointsIndex);
}